

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O1

void __thiscall
OpenMD::Plan<OpenMD::Vector<double,_7U>_>::Plan
          (Plan<OpenMD::Vector<double,_7U>_> *this,MPI_Comm comm,int nObjects)

{
  int *piVar1;
  pointer piVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int nCommProcs;
  uint local_2c [3];
  
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->myComm = comm;
  MPI_Comm_size(comm,local_2c);
  local_2c[2] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->counts,(long)(int)local_2c[0],(value_type_conflict2 *)(local_2c + 2));
  local_2c[1] = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (&this->displacements,(long)(int)local_2c[0],(value_type_conflict2 *)(local_2c + 1));
  this->planSize_ = nObjects * 7;
  MPI_Allgather(this,1,&ompi_mpi_int,
                (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start,1,&ompi_mpi_int,this->myComm);
  piVar1 = (this->displacements).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  *piVar1 = 0;
  if (1 < (int)local_2c[0]) {
    piVar2 = (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = *piVar1;
    lVar5 = 1;
    do {
      iVar3 = iVar3 + piVar2[lVar5 + -1];
      piVar1[lVar5] = iVar3;
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)local_2c[0]);
  }
  this->size_ = 0;
  if (0 < (int)local_2c[0]) {
    iVar3 = this->size_;
    piVar2 = (this->counts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      iVar3 = iVar3 + piVar2[uVar4];
      this->size_ = iVar3;
      uVar4 = uVar4 + 1;
    } while (local_2c[0] != uVar4);
  }
  return;
}

Assistant:

Plan<T>(MPI_Comm comm, int nObjects) : myComm(comm) {
      int nCommProcs;
      MPI_Comm_size(myComm, &nCommProcs);

      counts.resize(nCommProcs, 0);
      displacements.resize(nCommProcs, 0);

      planSize_ = MPITraits<T>::Length() * nObjects;

      MPI_Allgather(&planSize_, 1, MPI_INT, &counts[0], 1, MPI_INT, myComm);

      displacements[0] = 0;
      for (int i = 1; i < nCommProcs; i++) {
        displacements[i] = displacements[i - 1] + counts[i - 1];
      }

      size_ = 0;
      for (int i = 0; i < nCommProcs; i++) {
        size_ += counts[i];
      }
    }